

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O2

_Bool upb_EnumDef_CheckNumber(upb_EnumDef *e,int32_t num)

{
  uint32_t uVar1;
  upb_MiniTableEnum *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  _Bool _Var5;
  bool bVar6;
  
  puVar2 = e->layout;
  if ((uint)num < 0x40) {
    _Var5 = ((ulong)puVar2[1] >> ((ulong)(uint)num & 0x3f) & 1) != 0;
  }
  else {
    if (puVar2->mask_limit_dont_copy_me__upb_internal_use_only <= (uint)num) {
      uVar4 = puVar2->mask_limit_dont_copy_me__upb_internal_use_only >> 5;
      puVar3 = &puVar2[1].mask_limit_dont_copy_me__upb_internal_use_only + uVar4;
      do {
        bVar6 = puVar3 < &puVar2[1].mask_limit_dont_copy_me__upb_internal_use_only +
                         (uVar4 + puVar2->value_count_dont_copy_me__upb_internal_use_only);
        if (!bVar6) {
          return bVar6;
        }
        uVar1 = *puVar3;
        puVar3 = puVar3 + 1;
      } while (uVar1 != num);
      return bVar6;
    }
    _Var5 = ((&puVar2[1].mask_limit_dont_copy_me__upb_internal_use_only)[(uint)num >> 5] >>
             (num & 0x1fU) & 1) != 0;
  }
  return _Var5;
}

Assistant:

bool upb_EnumDef_CheckNumber(const upb_EnumDef* e, int32_t num) {
  // We could use upb_EnumDef_FindValueByNumber(e, num) != NULL, but we expect
  // this to be faster (especially for small numbers).
  return upb_MiniTableEnum_CheckValue(e->layout, num);
}